

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

void ps_search_base_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  dict_t *pdVar1;
  dict2pid_t *pdVar2;
  dict2pid_t *d2p_local;
  dict_t *dict_local;
  ps_search_t *search_local;
  
  dict_free(search->dict);
  dict2pid_free(search->d2p);
  if (dict == (dict_t *)0x0) {
    search->dict = (dict_t *)0x0;
    search->silence_wid = -1;
    search->finish_wid = -1;
    search->start_wid = -1;
    search->n_words = 0;
  }
  else {
    pdVar1 = dict_retain(dict);
    search->dict = pdVar1;
    search->start_wid = dict->startwid;
    search->finish_wid = dict->finishwid;
    search->silence_wid = dict->silwid;
    search->n_words = dict->n_word;
  }
  if (d2p == (dict2pid_t *)0x0) {
    search->d2p = (dict2pid_t *)0x0;
  }
  else {
    pdVar2 = dict2pid_retain(d2p);
    search->d2p = pdVar2;
  }
  return;
}

Assistant:

void
ps_search_base_reinit(ps_search_t *search, dict_t *dict,
                      dict2pid_t *d2p)
{
    dict_free(search->dict);
    dict2pid_free(search->d2p);
    /* FIXME: _retain() should just return NULL if passed NULL. */
    if (dict) {
        search->dict = dict_retain(dict);
        search->start_wid = dict_startwid(dict);
        search->finish_wid = dict_finishwid(dict);
        search->silence_wid = dict_silwid(dict);
        search->n_words = dict_size(dict);
    }
    else {
        search->dict = NULL;
        search->start_wid = search->finish_wid = search->silence_wid = -1;
        search->n_words = 0;
    }
    if (d2p)
        search->d2p = dict2pid_retain(d2p);
    else
        search->d2p = NULL;
}